

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O0

int coda_cursor_set_product(coda_cursor_conflict *cursor,coda_product *product)

{
  coda_product *product_local;
  coda_cursor_conflict *cursor_local;
  
  if (cursor == (coda_cursor_conflict *)0x0) {
    coda_set_error(-100,"cursor argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                   ,0x140);
    cursor_local._4_4_ = -1;
  }
  else if (product == (coda_product *)0x0) {
    coda_set_error(-100,"product file argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                   ,0x146);
    cursor_local._4_4_ = -1;
  }
  else {
    switch(product->format) {
    case coda_format_ascii:
    case coda_format_binary:
      cursor_local._4_4_ = coda_ascbin_cursor_set_product(cursor,product);
      break;
    case coda_format_xml:
      cursor_local._4_4_ = coda_xml_cursor_set_product(cursor,product);
      break;
    case coda_format_hdf4:
      coda_set_error(-0xb,(char *)0x0);
      cursor_local._4_4_ = -1;
      break;
    case coda_format_hdf5:
      coda_set_error(-0xd,(char *)0x0);
      cursor_local._4_4_ = -1;
      break;
    case coda_format_cdf:
      cursor_local._4_4_ = coda_cdf_cursor_set_product(cursor,product);
      break;
    case coda_format_netcdf:
      cursor_local._4_4_ = coda_netcdf_cursor_set_product(cursor,product);
      break;
    case coda_format_grib:
      cursor_local._4_4_ = coda_grib_cursor_set_product(cursor,product);
      break;
    case coda_format_rinex:
      cursor_local._4_4_ = coda_rinex_cursor_set_product(cursor,product);
      break;
    case coda_format_sp3:
      cursor_local._4_4_ = coda_sp3_cursor_set_product(cursor,product);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                    ,0x16b,"int coda_cursor_set_product(coda_cursor *, coda_product *)");
    }
  }
  return cursor_local._4_4_;
}

Assistant:

LIBCODA_API int coda_cursor_set_product(coda_cursor *cursor, coda_product *product)
{
    if (cursor == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "cursor argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (product == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "product file argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    switch (product->format)
    {
        case coda_format_ascii:
        case coda_format_binary:
            return coda_ascbin_cursor_set_product(cursor, product);
        case coda_format_xml:
            return coda_xml_cursor_set_product(cursor, product);
        case coda_format_cdf:
            return coda_cdf_cursor_set_product(cursor, product);
        case coda_format_netcdf:
            return coda_netcdf_cursor_set_product(cursor, product);
        case coda_format_grib:
            return coda_grib_cursor_set_product(cursor, product);
        case coda_format_hdf4:
#ifdef HAVE_HDF4
            return coda_hdf4_cursor_set_product(cursor, product);
#else
            coda_set_error(CODA_ERROR_NO_HDF4_SUPPORT, NULL);
            return -1;
#endif
        case coda_format_hdf5:
#ifdef HAVE_HDF5
            return coda_hdf5_cursor_set_product(cursor, product);
#else
            coda_set_error(CODA_ERROR_NO_HDF5_SUPPORT, NULL);
            return -1;
#endif
        case coda_format_rinex:
            return coda_rinex_cursor_set_product(cursor, product);
        case coda_format_sp3:
            return coda_sp3_cursor_set_product(cursor, product);
    }

    assert(0);
    exit(1);
}